

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O0

void __thiscall CTPNStmWhile::gen_code(CTPNStmWhile *this,int param_2,int param_3)

{
  long *plVar1;
  CTPNStmEnclosing *stm;
  CTcCodeLabel *substm;
  CTcCodeLabel *lbl;
  undefined4 in_EDX;
  undefined4 in_ESI;
  CTcCodeStream *in_RDI;
  CTPNStmEnclosing *old_enclosing;
  CTcCodeLabel *end_lbl;
  CTcCodeLabel *top_lbl;
  uchar in_stack_000000bf;
  CTcGenTarg *in_stack_000000c0;
  CTcCodeLabel *in_stack_ffffffffffffffc8;
  
  CTPNStmBase::add_debug_line_rec((CTPNStmBase *)in_RDI);
  stm = CTcCodeStream::set_enclosing(G_cs,(CTPNStmEnclosing *)in_RDI);
  substm = CTcPrsNode::new_label_here();
  lbl = CTcCodeStream::new_label_fwd(in_RDI);
  plVar1 = (long *)(in_RDI->super_CTcDataStream).page_cur_;
  (**(code **)(*plVar1 + 0xa0))(plVar1,0,lbl);
  (in_RDI->super_CTcDataStream).page_slots_ = (size_t)lbl;
  (in_RDI->super_CTcDataStream).page_cnt_ = (size_t)substm;
  if ((in_RDI->super_CTcDataStream).pages_ != (char **)0x0) {
    CTPNStmBase::gen_code_substm((CTPNStmBase *)CONCAT44(in_ESI,in_EDX),(CTPNStm *)substm);
  }
  CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
  CTcCodeStream::write_ofs2(in_RDI,in_stack_ffffffffffffffc8,0);
  CTcPrsNode::def_label_pos(lbl);
  CTcCodeStream::set_enclosing(G_cs,stm);
  return;
}

Assistant:

void CTPNStmWhile::gen_code(int, int)
{
    CTcCodeLabel *top_lbl;
    CTcCodeLabel *end_lbl;
    CTPNStmEnclosing *old_enclosing;

    /* add a line record */
    add_debug_line_rec();

    /* push the enclosing statement */
    old_enclosing = G_cs->set_enclosing(this);

    /* set the label for the top of the loop */
    top_lbl = new_label_here();

    /* generate a label for the end of the loop */
    end_lbl = G_cs->new_label_fwd();

    /* generate the condition, jumping to the end of the loop if false */
    cond_expr_->gen_code_cond(0, end_lbl);

    /* 
     *   set the 'break' and 'continue' label in our node, so that 'break'
     *   and 'continue' statements in subnodes can find the labels during
     *   code generation 
     */
    break_lbl_ = end_lbl;
    cont_lbl_ = top_lbl;

    /* if we have a body, generate it */
    if (body_stm_ != 0)
        gen_code_substm(body_stm_);

    /* 
     *   add another line record - the jump back to the top of the loop is
     *   part of the 'while' itself 
     */
//$$$    add_debug_line_rec();

    /* jump back to the top of the loop */
    G_cg->write_op(OPC_JMP);
    G_cs->write_ofs2(top_lbl, 0);

    /* 
     *   we're at the end of the loop - this is where we jump for 'break'
     *   and when the condition becomes false 
     */
    def_label_pos(end_lbl);

    /* restore the enclosing statement */
    G_cs->set_enclosing(old_enclosing);
}